

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.h
# Opt level: O3

void __thiscall RasterizerA2::clear(RasterizerA2 *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Bounds *pBVar4;
  size_t sVar5;
  Cell *pCVar6;
  ulong uVar7;
  
  if ((this->super_CellRasterizer).super_Rasterizer._width != 0) {
    uVar1 = (this->_yBounds).start;
    uVar7 = (ulong)(int)uVar1;
    uVar2 = (this->_yBounds).end;
    if (uVar1 <= uVar2) {
      sVar5 = this->_cellStride;
      pBVar4 = this->_xBounds;
      pCVar6 = this->_cells + sVar5 * uVar7;
      do {
        iVar3 = pBVar4[uVar7].start;
        if (iVar3 <= pBVar4[uVar7].end) {
          memset(pCVar6 + iVar3,0,(long)((pBVar4[uVar7].end - iVar3) + 1) << 3);
          pBVar4 = this->_xBounds;
          pBVar4[uVar7].start = 0x7fffffff;
          pBVar4[uVar7].end = 0;
          sVar5 = this->_cellStride;
        }
        pCVar6 = pCVar6 + sVar5;
        uVar7 = uVar7 + 1;
      } while (uVar7 <= (ulong)(long)(int)uVar2);
    }
    (this->_yBounds).start = 0x7fffffff;
    (this->_yBounds).end = 0;
  }
  return;
}

Assistant:

inline bool isInitialized() const noexcept { return _width != 0; }